

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.hpp
# Opt level: O2

void __thiscall
Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>::PreMonom
          (PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_> *this,Numeral *n,
          initializer_list<Kernel::PolyNf> factors)

{
  RationalConstantType::RationalConstantType(&this->numeral,n);
  Lib::Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            (&this->factors);
  Lib::Stack<Kernel::PolyNf>::init
            ((this->factors)._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl,
             (EVP_PKEY_CTX *)factors._M_array);
  return;
}

Assistant:

PreMonom(Numeral n, std::initializer_list<PolyNf> factors) : numeral(std::move(n)), factors() 
  { this->factors->init(factors); }